

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBeliefEventDriven.cpp
# Opt level: O1

double __thiscall
JointBeliefEventDriven::Update
          (JointBeliefEventDriven *this,MultiAgentDecisionProcessDiscreteInterface *pu,Index lastJAI
          ,Index newJOI)

{
  new_allocator<double> *pnVar1;
  size_type sVar2;
  pointer pdVar3;
  char cVar4;
  new_allocator<double> **ppnVar5;
  long lVar6;
  long lVar7;
  EventObservationModelMapping *this_00;
  Matrix *pMVar8;
  long *plVar9;
  double *pdVar10;
  new_allocator<double> *pnVar11;
  E *this_01;
  int iVar12;
  int iVar13;
  size_type sVar14;
  long lVar15;
  new_allocator<double> **ppnVar16;
  uint uVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> bUpdated;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> res;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> b;
  new_allocator<double> *local_e0;
  Matrix *local_d8;
  new_allocator<double> **ppnStack_d0;
  double local_c8;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> local_c0;
  new_allocator<double> local_a8 [8];
  new_allocator<double> **local_a0;
  double *pdStack_98;
  new_allocator<double> local_90 [8];
  new_allocator<double> **local_88;
  double *local_80;
  new_allocator<double> *local_78;
  Matrix *pMStack_70;
  new_allocator<double> local_68 [8];
  size_type local_60;
  double *local_58;
  JointBeliefEventDriven *local_50;
  long *local_48;
  new_allocator<double> *local_40;
  new_allocator<double> **local_38;
  
  cVar4 = (**(code **)((long)*pu + 0x140))(pu);
  if (cVar4 == '\0') {
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,"Trying to use a JointBeliefEventDriven on a model without event observability.");
    __cxa_throw(this_01,&E::typeinfo,E::~E);
  }
  ppnVar5 = (new_allocator<double> **)(**(code **)((long)*pu + 0x30))(pu);
  lVar6 = (**(code **)((long)*pu + 0x130))(pu);
  if (lVar6 == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = __dynamic_cast(lVar6,&TransitionModelDiscrete::typeinfo,
                           &TransitionModelMapping::typeinfo,0);
  }
  lVar7 = (**(code **)((long)*pu + 0x138))(pu);
  if (lVar7 == 0) {
    this_00 = (EventObservationModelMapping *)0x0;
  }
  else {
    this_00 = (EventObservationModelMapping *)
              __dynamic_cast(lVar7,&ObservationModelDiscrete::typeinfo,
                             &EventObservationModelMapping::typeinfo,0);
  }
  local_c8 = 0.0;
  if ((lVar6 != 0) && (this_00 != (EventObservationModelMapping *)0x0)) {
    if ((ulong)(*(long *)(lVar6 + 0x18) - *(long *)(lVar6 + 0x10) >> 3) <= (ulong)lastJAI) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    pnVar1 = *(new_allocator<double> **)(*(long *)(lVar6 + 0x10) + (ulong)lastJAI * 8);
    local_c8 = (double)(ulong)lastJAI;
    pMVar8 = EventObservationModelMapping::GetMatrixPtr(this_00,lastJAI,newJOI);
    plVar9 = (long *)operator_new(0x28);
    lVar6 = *(long *)pnVar1;
    *plVar9 = lVar6;
    lVar7 = *(long *)(pnVar1 + 8);
    plVar9[1] = lVar7;
    sVar14 = lVar7 * lVar6;
    plVar9[3] = sVar14;
    if (sVar14 == 0) {
      pdVar10 = (double *)0x0;
      local_78 = pnVar1;
      pMStack_70 = pMVar8;
    }
    else {
      local_78 = pnVar1;
      pMStack_70 = pMVar8;
      pdVar10 = __gnu_cxx::new_allocator<double>::allocate
                          ((new_allocator<double> *)(plVar9 + 2),sVar14,(void *)0x0);
    }
    plVar9[4] = (long)pdVar10;
    boost::numeric::ublas::
    indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
              (plVar9,&local_78);
    local_78 = (new_allocator<double> *)*plVar9;
    pMStack_70 = (Matrix *)plVar9[1];
    local_60 = plVar9[3];
    if (local_60 == 0) {
      local_58 = (double *)0x0;
    }
    else {
      local_58 = __gnu_cxx::new_allocator<double>::allocate(local_68,local_60,(void *)0x0);
      if (plVar9[3] != 0) {
        memmove(local_58,(void *)plVar9[4],plVar9[3] << 3);
      }
    }
    local_88 = ppnVar5;
    if (ppnVar5 == (new_allocator<double> **)0x0) {
      local_80 = (double *)0x0;
    }
    else {
      local_80 = __gnu_cxx::new_allocator<double>::allocate(local_90,(size_type)ppnVar5,(void *)0x0)
      ;
    }
    lVar6 = *(long *)(&this->field_0x10 + *(long *)(*(long *)this + -0xd8));
    lVar7 = *(long *)(&this->field_0x18 + *(long *)(*(long *)this + -0xd8)) - lVar6 >> 3;
    if (0 < lVar7) {
      lVar7 = lVar7 + 1;
      lVar15 = 0;
      do {
        *(undefined8 *)((long)local_80 + lVar15) = *(undefined8 *)(lVar6 + lVar15);
        lVar15 = lVar15 + 8;
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    local_a0 = ppnVar5;
    if (ppnVar5 == (new_allocator<double> **)0x0) {
      pdStack_98 = (double *)0x0;
    }
    else {
      pdStack_98 = __gnu_cxx::new_allocator<double>::allocate
                             (local_a8,(size_type)ppnVar5,(void *)0x0);
    }
    if (local_a0 != (new_allocator<double> **)0x0) {
      memset(pdStack_98,0,(long)local_a0 << 3);
    }
    local_e0 = local_90;
    local_c0.data_.size_ = (size_type)pMStack_70;
    local_d8 = (Matrix *)&local_78;
    if (pMStack_70 == (Matrix *)0x0) {
      local_c0.data_.data_ = (pointer)0x0;
    }
    else {
      local_c0.data_.data_ =
           __gnu_cxx::new_allocator<double>::allocate
                     ((new_allocator<double> *)&local_c0,(size_type)pMStack_70,(void *)0x0);
    }
    boost::numeric::ublas::
    indexing_vector_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,double>>>
              (&local_c0,
               (vector_expression<boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>_>
                *)&local_e0);
    if (-1 < this->_m_falseNegativeObs) {
      pMVar8 = EventObservationModelMapping::GetMatrixPtr
                         (this_00,local_c8._0_4_,this->_m_falseNegativeObs);
      pnVar11 = (new_allocator<double> *)operator_new(0x28);
      lVar6 = *(long *)pnVar1;
      *(long *)pnVar11 = lVar6;
      lVar7 = *(long *)(pnVar1 + 8);
      *(long *)(pnVar11 + 8) = lVar7;
      sVar14 = lVar7 * lVar6;
      *(size_type *)(pnVar11 + 0x18) = sVar14;
      local_e0 = pnVar1;
      local_d8 = pMVar8;
      if (sVar14 == 0) {
        pdVar10 = (double *)0x0;
      }
      else {
        pdVar10 = __gnu_cxx::new_allocator<double>::allocate(pnVar11 + 0x10,sVar14,(void *)0x0);
      }
      *(double **)(pnVar11 + 0x20) = pdVar10;
      local_50 = this;
      local_48 = plVar9;
      boost::numeric::ublas::
      indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
                (pnVar11,&local_e0);
      iVar12 = 0;
      local_c8 = 0.01;
      uVar17 = 0;
      while( true ) {
        local_e0 = pnVar11;
        local_d8 = (Matrix *)&local_78;
        boost::numeric::ublas::
        indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,double>>>
                  (&local_78,(new_allocator<double> *)&local_e0);
        local_40 = local_90;
        local_d8 = pMStack_70;
        local_38 = &local_78;
        if (pMStack_70 == (Matrix *)0x0) {
          ppnStack_d0 = (new_allocator<double> **)0x0;
        }
        else {
          ppnStack_d0 = (new_allocator<double> **)
                        __gnu_cxx::new_allocator<double>::allocate
                                  ((new_allocator<double> *)&local_e0,(size_type)pMStack_70,
                                   (void *)0x0);
        }
        boost::numeric::ublas::
        indexing_vector_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,double>>>
                  ((vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)&local_e0,
                   (vector_expression<boost::numeric::ublas::matrix_vector_binary2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_vector_prod2<boost::numeric::ublas::vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>_>
                    *)&local_40);
        pdVar10 = pdStack_98;
        ppnVar5 = local_a0;
        local_a0 = (new_allocator<double> **)local_d8;
        pdStack_98 = (double *)ppnStack_d0;
        local_d8 = (Matrix *)ppnVar5;
        ppnStack_d0 = (new_allocator<double> **)pdVar10;
        if (ppnVar5 != (new_allocator<double> **)0x0) {
          operator_delete(pdVar10,(long)ppnVar5 << 3);
        }
        local_d8 = (Matrix *)local_c0.data_.size_;
        if ((new_allocator<double> **)local_c0.data_.size_ == (new_allocator<double> **)0x0) {
          ppnStack_d0 = (new_allocator<double> **)0x0;
        }
        else {
          ppnStack_d0 = (new_allocator<double> **)
                        __gnu_cxx::new_allocator<double>::allocate
                                  ((new_allocator<double> *)&local_e0,local_c0.data_.size_,
                                   (void *)0x0);
        }
        pdVar3 = local_c0.data_.data_;
        sVar2 = local_c0.data_.size_;
        if (local_d8 != (Matrix *)0x0) {
          ppnVar5 = (new_allocator<double> **)0x0;
          do {
            ppnStack_d0[(long)ppnVar5] =
                 (new_allocator<double> *)
                 ((double)local_c0.data_.data_[(long)ppnVar5] + pdStack_98[(long)ppnVar5]);
            ppnVar5 = (new_allocator<double> **)((long)ppnVar5 + 1);
          } while (local_d8 != (Matrix *)ppnVar5);
        }
        local_c0.data_.size_ = (size_type)local_d8;
        local_d8 = (Matrix *)sVar2;
        local_c0.data_.data_ = (pointer)ppnStack_d0;
        ppnStack_d0 = (new_allocator<double> **)pdVar3;
        if ((new_allocator<double> **)sVar2 != (new_allocator<double> **)0x0) {
          operator_delete(pdVar3,sVar2 << 3);
        }
        dVar20 = local_c8;
        if ((new_allocator<double> **)local_c0.data_.size_ != (new_allocator<double> **)0x0) {
          dVar19 = 0.0;
          ppnVar5 = (new_allocator<double> **)0x0;
          do {
            dVar19 = dVar19 + (double)local_c0.data_.data_[(long)ppnVar5];
            ppnVar5 = (new_allocator<double> **)((long)ppnVar5 + 1);
          } while ((new_allocator<double> **)local_c0.data_.size_ != ppnVar5);
          if ((0.0 < dVar19) && (dVar20 = 0.0, local_a0 != (new_allocator<double> **)0x0)) {
            ppnVar5 = (new_allocator<double> **)0x0;
            do {
              dVar20 = dVar20 + pdStack_98[(long)ppnVar5];
              ppnVar5 = (new_allocator<double> **)((long)ppnVar5 + 1);
            } while (local_a0 != ppnVar5);
          }
        }
        iVar13 = iVar12 + 1;
        if (dVar20 < local_c8) {
          iVar13 = 0;
        }
        iVar12 = 0;
        if (local_c8 != 0.0) {
          iVar12 = iVar13;
        }
        if (NAN(local_c8)) {
          iVar12 = iVar13;
        }
        if (9 < iVar12) break;
        if ((dVar20 < 0.01) || (bVar18 = 8 < uVar17, uVar17 = uVar17 + 1, local_c8 = dVar20, bVar18)
           ) goto LAB_003f9b48;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Warning: Event-driven belief update not converging! - The system has non-observable chains."
                 ,0x5b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
LAB_003f9b48:
      if (*(long *)(pnVar11 + 0x18) != 0) {
        operator_delete(*(void **)(pnVar11 + 0x20),*(long *)(pnVar11 + 0x18) << 3);
      }
      operator_delete(pnVar11,0x28);
      plVar9 = local_48;
      this = local_50;
    }
    local_c8 = 0.0;
    if ((new_allocator<double> **)local_c0.data_.size_ != (new_allocator<double> **)0x0) {
      ppnVar5 = (new_allocator<double> **)0x0;
      local_c8 = 0.0;
      do {
        local_c8 = local_c8 + (double)local_c0.data_.data_[(long)ppnVar5];
        ppnVar5 = (new_allocator<double> **)((long)ppnVar5 + 1);
      } while ((new_allocator<double> **)local_c0.data_.size_ != ppnVar5);
    }
    if (local_c8 <= 0.0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Event-driven belief update failed: The system is badly conditioned. There is 0 probability of observing this symbol given this belief."
                 ,0x86);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
    }
    else {
      local_d8 = (Matrix *)local_c0.data_.size_;
      if ((new_allocator<double> **)local_c0.data_.size_ == (new_allocator<double> **)0x0) {
        ppnVar5 = (new_allocator<double> **)0x0;
      }
      else {
        ppnVar5 = (new_allocator<double> **)
                  __gnu_cxx::new_allocator<double>::allocate
                            ((new_allocator<double> *)&local_e0,local_c0.data_.size_,(void *)0x0);
      }
      pdVar3 = local_c0.data_.data_;
      sVar2 = local_c0.data_.size_;
      if (local_d8 != (Matrix *)0x0) {
        ppnVar16 = (new_allocator<double> **)0x0;
        do {
          ppnVar5[(long)ppnVar16] =
               (new_allocator<double> *)((double)local_c0.data_.data_[(long)ppnVar16] / local_c8);
          ppnVar16 = (new_allocator<double> **)((long)ppnVar16 + 1);
        } while (local_d8 != (Matrix *)ppnVar16);
      }
      local_c0.data_.size_ = (size_type)local_d8;
      local_d8 = (Matrix *)sVar2;
      ppnStack_d0 = (new_allocator<double> **)local_c0.data_.data_;
      local_c0.data_.data_ = (pointer)ppnVar5;
      if ((new_allocator<double> **)sVar2 != (new_allocator<double> **)0x0) {
        operator_delete(pdVar3,sVar2 << 3);
      }
      lVar6 = *(long *)this;
      lVar7 = *(long *)(lVar6 + -0xd8);
      if (*(long *)(&this->field_0x18 + lVar7) != *(long *)(&this->field_0x10 + lVar7)) {
        *(long *)(&this->field_0x18 + lVar7) = *(long *)(&this->field_0x10 + lVar7);
      }
      local_38 = (new_allocator<double> **)(local_c0.data_.data_ + local_c0.data_.size_);
      local_e0 = (new_allocator<double> *)&local_c0;
      local_d8 = (Matrix *)local_c0.data_.data_;
      local_40 = local_e0;
      std::vector<double,std::allocator<double>>::
      _M_range_insert<boost::numeric::ublas::vector<double,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>::iterator>
                ((vector<double,std::allocator<double>> *)
                 (&this->field_0x10 + *(long *)(lVar6 + -0xd8)),
                 *(undefined8 *)
                  ((vector<double,std::allocator<double>> *)
                   (&this->field_0x10 + *(long *)(lVar6 + -0xd8)) + 8));
    }
    if (plVar9[3] != 0) {
      operator_delete((void *)plVar9[4],plVar9[3] << 3);
    }
    operator_delete(plVar9,0x28);
    if ((new_allocator<double> **)local_c0.data_.size_ != (new_allocator<double> **)0x0) {
      operator_delete(local_c0.data_.data_,local_c0.data_.size_ << 3);
    }
    if (local_a0 != (new_allocator<double> **)0x0) {
      operator_delete(pdStack_98,(long)local_a0 << 3);
    }
    if (local_88 != (new_allocator<double> **)0x0) {
      operator_delete(local_80,(long)local_88 << 3);
    }
    if (local_60 != 0) {
      operator_delete(local_58,local_60 << 3);
    }
  }
  return local_c8;
}

Assistant:

double JointBeliefEventDriven::Update(const MultiAgentDecisionProcessDiscreteInterface &pu,
                                      Index lastJAI, Index newJOI)
{
    using namespace boost::numeric::ublas;

    if(!pu.GetEventObservability())
        throw E("Trying to use a JointBeliefEventDriven on a model without event observability.");

    size_t nrS = pu.GetNrStates();
    
    const TransitionModelMapping *T = dynamic_cast<const TransitionModelMapping *>(pu.GetTransitionModelDiscretePtr());
    const EventObservationModelMapping *O = dynamic_cast<const EventObservationModelMapping *>(pu.GetObservationModelDiscretePtr());
    double eta = 0;
    if(T != 0 && O != 0)
    {
        using namespace boost::numeric::ublas;
      
        //we need to break the abstraction here since we'll be using ublas over T and O.
        //Ideally, we could have some kind of built in conversion.
        const matrix<double>* Ta = T->GetMatrixPtr(lastJAI);
        const matrix<double>* Oao = O->GetMatrixPtr(lastJAI,newJOI);
        matrix<double>* Hao = new matrix<double>(element_prod(*Ta,*Oao));
      
        matrix<double> H = *Hao;
      
        double epsilon, last_epsilon = 0;
      
        //We need b in ublas form.
        boost::numeric::ublas::vector<double> b(nrS);
        std::copy(_m_b.begin(), _m_b.end(), b.begin());

        boost::numeric::ublas::vector<double> res = zero_vector<double>(nrS);
        boost::numeric::ublas::vector<double> bUpdated = prod(b,H);
        epsilon = JointBeliefEventDriven_convergenceTh;
        if(_m_falseNegativeObs >= 0)
        {
            const matrix<double>* Oaf = O->GetMatrixPtr(lastJAI,_m_falseNegativeObs);
            //At this point we have two |S|x|S| matrices
            //What we want to do is; 
            //Hao = Ta.*Oao;
            //Haf = Ta.*Oaf;
            //b' = (b^T * (inv(I - Haf) * Hao))/n
            //Since we can't compute the inverse of arbitrarily large matrices, we have to approximate this
            //by cutting off the respective power series (I + Haf + Haf^2 + Haf^3 + ...) at some point.
            //Since Ta, Oao, Oaf are defined over (s,s') and we want to avoid having to transpose,
            //we have to left-multiply this by b^T to get the update
            //We also cannot rely on determinant / trace, so we have to keep track of b' and see if it is converging.

            matrix<double>* Haf = new matrix<double>(element_prod(*Ta,*Oaf));
            for(int safety_s=0, safety_h=0; 
                epsilon >= JointBeliefEventDriven_convergenceTh && safety_h < JointBeliefEventDriven_hardCap;
                safety_h++)
            {
                noalias(H) = prod(*Haf, H); //remember that we are implicitly using transposes.
                res = prod(b,H);
              
                bUpdated = bUpdated + res;
                last_epsilon = epsilon;
                if(sum(bUpdated) > 0)
                    epsilon = sum(res);
              
                if(last_epsilon != 0 && epsilon >= last_epsilon){
                    safety_s++;
                }else{
                    safety_s=0;
                }
                if(safety_s >= JointBeliefEventDriven_softCap){
                    cout << "Warning: Event-driven belief update not converging! - The system has non-observable chains." << endl;
                    break;
                }
            }
      
            delete Haf;
        }
        //only the normalization factor remains
        eta = sum(bUpdated);

        if(eta > 0)
        {
            bUpdated = bUpdated / eta;
      
            _m_b.clear();
            _m_b.insert(_m_b.end(), bUpdated.begin(), bUpdated.end());
        }
        else
        {
            cout << "Event-driven belief update failed: The system is badly conditioned. There is 0 probability of observing this symbol given this belief." << endl;
        }  
      
        delete Hao;      
    }
    
#if JointBeliefEventDriven_doSanityCheckAfterEveryUpdate
    if(!SanityCheck())
        throw(E("JointBeliefEventDriven::Update SanityCheck failed"));
#endif

    return(eta);
}